

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O0

void Amap_LibertyWipeOutComments(char *pBeg,char *pEnd)

{
  char *local_28;
  char *pStart;
  char *pCur;
  char *pEnd_local;
  char *pBeg_local;
  
  pStart = pBeg;
LAB_0047b7d4:
  if (pEnd <= pStart) {
    return;
  }
  if ((*pStart == '/') && (pStart[1] == '*')) {
    local_28 = pStart;
    for (; pStart < pEnd; pStart = pStart + 1) {
      if ((*pStart == '*') && (pStart[1] == '/')) goto LAB_0047b82c;
    }
  }
  goto LAB_0047b874;
LAB_0047b82c:
  for (; local_28 < pStart + 2; local_28 = local_28 + 1) {
    if (*local_28 != '\n') {
      *local_28 = ' ';
    }
  }
LAB_0047b874:
  pStart = pStart + 1;
  goto LAB_0047b7d4;
}

Assistant:

void Amap_LibertyWipeOutComments( char * pBeg, char * pEnd )
{
    char * pCur, * pStart;
    for ( pCur = pBeg; pCur < pEnd; pCur++ )
    if ( pCur[0] == '/' && pCur[1] == '*' )
        for ( pStart = pCur; pCur < pEnd; pCur++ )
        if ( pCur[0] == '*' && pCur[1] == '/' )
        {
            for ( ; pStart < pCur + 2; pStart++ )
            if ( *pStart != '\n' ) *pStart = ' ';
            break;
        }
}